

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<pstore::address> *
testing::internal::ActionResultHolder<pstore::address>::
PerformDefaultAction<pstore::address(unsigned_long,unsigned_int)>
          (FunctionMocker<pstore::address_(unsigned_long,_unsigned_int)> *func_mocker,
          ArgumentTuple *args,string *call_description)

{
  ActionResultHolder<pstore::address> *this;
  Result value;
  Wrapper local_28;
  string *local_20;
  string *call_description_local;
  ArgumentTuple *args_local;
  FunctionMocker<pstore::address_(unsigned_long,_unsigned_int)> *func_mocker_local;
  
  local_20 = call_description;
  call_description_local = (string *)args;
  args_local = (ArgumentTuple *)func_mocker;
  this = (ActionResultHolder<pstore::address> *)operator_new(0x10);
  value = FunctionMocker<pstore::address_(unsigned_long,_unsigned_int)>::PerformDefaultAction
                    ((FunctionMocker<pstore::address_(unsigned_long,_unsigned_int)> *)args_local,
                     (ArgumentTuple *)call_description_local,local_20);
  ReferenceOrValueWrapper<pstore::address>::ReferenceOrValueWrapper(&local_28,(address)value.a_);
  ActionResultHolder(this,local_28);
  return this;
}

Assistant:

static ActionResultHolder* PerformDefaultAction(
      const FunctionMocker<F>* func_mocker,
      typename Function<F>::ArgumentTuple&& args,
      const std::string& call_description) {
    return new ActionResultHolder(Wrapper(func_mocker->PerformDefaultAction(
        std::move(args), call_description)));
  }